

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivySeq.c
# Opt level: O0

int Ivy_ManRewriteSeq(Ivy_Man_t *p,int fUseZeroCost,int fVerbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  abctime aVar4;
  Ivy_Obj_t *pIVar5;
  Rwt_Man_t *p_00;
  Ivy_Obj_t *pIVar6;
  Dec_Graph_t *pGraph_00;
  abctime aVar7;
  abctime aVar8;
  int fCompl;
  Dec_Graph_t *pGraph;
  abctime clkStart;
  abctime clk;
  int nGain;
  int nNodes;
  int i;
  Ivy_Obj_t *pNode;
  Rwt_Man_t *pManRwt;
  int fVerbose_local;
  int fUseZeroCost_local;
  Ivy_Man_t *p_local;
  
  aVar4 = Abc_Clock();
  for (nGain = 0; iVar1 = Vec_PtrSize(p->vObjs), nGain < iVar1; nGain = nGain + 1) {
    pIVar5 = (Ivy_Obj_t *)Vec_PtrEntry(p->vObjs,nGain);
    if ((pIVar5 != (Ivy_Obj_t *)0x0) && (iVar1 = Ivy_ObjIsLatch(pIVar5), iVar1 != 0)) {
      *(uint *)&pIVar5->field_0x8 = *(uint *)&pIVar5->field_0x8 & 0xfffff9ff | 0x600;
    }
  }
  p_00 = Rwt_ManStart(0);
  p->pData = p_00;
  if (p_00 == (Rwt_Man_t *)0x0) {
    p_local._4_4_ = 0;
  }
  else {
    if (p->fFanout == 0) {
      Ivy_ManStartFanout(p);
    }
    iVar1 = Ivy_ManObjIdMax(p);
    for (nGain = 0; iVar2 = Vec_PtrSize(p->vObjs), nGain < iVar2; nGain = nGain + 1) {
      pIVar5 = (Ivy_Obj_t *)Vec_PtrEntry(p->vObjs,nGain);
      if ((pIVar5 != (Ivy_Obj_t *)0x0) && (iVar2 = Ivy_ObjIsNode(pIVar5), iVar2 != 0)) {
        iVar2 = Ivy_ObjIsBuf(pIVar5);
        if (iVar2 != 0) {
          __assert_fail("!Ivy_ObjIsBuf(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivySeq.c"
                        ,0x55,"int Ivy_ManRewriteSeq(Ivy_Man_t *, int, int)");
        }
        pIVar6 = Ivy_ObjFanin0(pIVar5);
        iVar2 = Ivy_ObjIsBuf(pIVar6);
        if (iVar2 != 0) {
          __assert_fail("!Ivy_ObjIsBuf(Ivy_ObjFanin0(pNode))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivySeq.c"
                        ,0x56,"int Ivy_ManRewriteSeq(Ivy_Man_t *, int, int)");
        }
        pIVar6 = Ivy_ObjFanin1(pIVar5);
        iVar2 = Ivy_ObjIsBuf(pIVar6);
        if (iVar2 != 0) {
          __assert_fail("!Ivy_ObjIsBuf(Ivy_ObjFanin1(pNode))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivySeq.c"
                        ,0x57,"int Ivy_ManRewriteSeq(Ivy_Man_t *, int, int)");
        }
        if (iVar1 < nGain) break;
        iVar2 = Ivy_NodeRewriteSeq(p,p_00,pIVar5,fUseZeroCost);
        if ((0 < iVar2) || ((iVar2 == 0 && (fUseZeroCost != 0)))) {
          pGraph_00 = (Dec_Graph_t *)Rwt_ManReadDecs(p_00);
          iVar3 = Rwt_ManReadCompl(p_00);
          aVar8 = Abc_Clock();
          if (iVar3 != 0) {
            Dec_GraphComplement(pGraph_00);
          }
          Ivy_GraphUpdateNetworkSeq(p,pIVar5,pGraph_00,iVar2);
          if (iVar3 != 0) {
            Dec_GraphComplement(pGraph_00);
          }
          aVar7 = Abc_Clock();
          Rwt_ManAddTimeUpdate(p_00,aVar7 - aVar8);
        }
      }
    }
    aVar8 = Abc_Clock();
    Rwt_ManAddTimeTotal(p_00,aVar8 - aVar4);
    if (fVerbose != 0) {
      Rwt_ManPrintStats(p_00);
    }
    Rwt_ManStop(p_00);
    p->pData = (void *)0x0;
    Ivy_ManResetLevels(p);
    iVar1 = Ivy_ManCheck(p);
    if (iVar1 == 0) {
      printf("Ivy_ManRewritePre(): The check has failed.\n");
    }
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

int Ivy_ManRewriteSeq( Ivy_Man_t * p, int fUseZeroCost, int fVerbose )
{ 
    Rwt_Man_t * pManRwt;
    Ivy_Obj_t * pNode;
    int i, nNodes, nGain;
    abctime clk, clkStart = Abc_Clock();

    // set the DC latch values
    Ivy_ManForEachLatch( p, pNode, i )
        pNode->Init = IVY_INIT_DC;
    // start the rewriting manager
    pManRwt = Rwt_ManStart( 0 );
    p->pData = pManRwt;
    if ( pManRwt == NULL )
        return 0; 
    // create fanouts
    if ( p->fFanout == 0 )
        Ivy_ManStartFanout( p );
    // resynthesize each node once
    nNodes = Ivy_ManObjIdMax(p);
    Ivy_ManForEachNode( p, pNode, i )
    {
        assert( !Ivy_ObjIsBuf(pNode) );
        assert( !Ivy_ObjIsBuf(Ivy_ObjFanin0(pNode)) );
        assert( !Ivy_ObjIsBuf(Ivy_ObjFanin1(pNode)) );
        // fix the fanin buffer problem
//        Ivy_NodeFixBufferFanins( p, pNode );
//        if ( Ivy_ObjIsBuf(pNode) )
//            continue;
        // stop if all nodes have been tried once
        if ( i > nNodes ) 
            break;
        // for each cut, try to resynthesize it
        nGain = Ivy_NodeRewriteSeq( p, pManRwt, pNode, fUseZeroCost );
        if ( nGain > 0 || (nGain == 0 && fUseZeroCost) )
        {
            Dec_Graph_t * pGraph = (Dec_Graph_t *)Rwt_ManReadDecs(pManRwt);
            int fCompl           = Rwt_ManReadCompl(pManRwt);
            // complement the FF if needed
clk = Abc_Clock();
            if ( fCompl ) Dec_GraphComplement( pGraph );
            Ivy_GraphUpdateNetworkSeq( p, pNode, pGraph, nGain );
            if ( fCompl ) Dec_GraphComplement( pGraph );
Rwt_ManAddTimeUpdate( pManRwt, Abc_Clock() - clk );
        }
    }
Rwt_ManAddTimeTotal( pManRwt, Abc_Clock() - clkStart );
    // print stats
    if ( fVerbose )
        Rwt_ManPrintStats( pManRwt );
    // delete the managers
    Rwt_ManStop( pManRwt );
    p->pData = NULL;
    // fix the levels
    Ivy_ManResetLevels( p );
//    if ( Ivy_ManCheckFanoutNums(p) )
//        printf( "Ivy_ManRewritePre(): The check has failed.\n" );
    // check
    if ( !Ivy_ManCheck(p) )
        printf( "Ivy_ManRewritePre(): The check has failed.\n" );
    return 1;
}